

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,int i)

{
  uint32_t u;
  char *pcVar1;
  char *pcVar2;
  char buffer [11];
  char local_23;
  char local_22 [10];
  
  pcVar1 = &local_23;
  if (i < 0) {
    local_23 = '-';
    i = -i;
    pcVar1 = local_22;
  }
  pcVar1 = internal::u32toa(i,pcVar1);
  if (&local_23 != pcVar1) {
    pcVar2 = &local_23;
    do {
      std::ostream::put((char)this->os_->stream_);
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != pcVar1);
  }
  return true;
}

Assistant:

bool WriteInt(int i) {
        char buffer[11];
        const char* end = internal::i32toa(i, buffer);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (const char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }